

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_zTXt(LodePNGInfo *info,LodePNGDecoderSettings *decoder,uchar *data,size_t chunkLength
                   )

{
  int iVar1;
  char *key_00;
  ulong in_RCX;
  void *in_RDX;
  void *in_RSI;
  bool bVar2;
  size_t size;
  uchar *str;
  char *key;
  uint string2_begin;
  uint length;
  LodePNGDecompressSettings zlibsettings;
  uint error;
  uchar *size_00;
  char *str_00;
  uint uVar3;
  size_t in_stack_ffffffffffffffb0;
  uchar *in;
  size_t in_stack_ffffffffffffffc0;
  size_t *in_stack_ffffffffffffffc8;
  uchar **in_stack_ffffffffffffffd0;
  uint local_24;
  
  memcpy(&stack0xffffffffffffffb0,in_RSI,0x28);
  str_00 = (char *)0x0;
  size_00 = (uchar *)0x0;
  uVar3 = 0;
  while( true ) {
    bVar2 = false;
    if (uVar3 < in_RCX) {
      bVar2 = *(char *)((long)in_RDX + (ulong)uVar3) != '\0';
    }
    if (!bVar2) break;
    uVar3 = uVar3 + 1;
  }
  if (uVar3 + 2 < in_RCX) {
    if ((uVar3 == 0) || (0x4f < uVar3)) {
      local_24 = 0x59;
    }
    else {
      key_00 = (char *)lodepng_malloc(0x820665);
      if (key_00 == (char *)0x0) {
        local_24 = 0x53;
      }
      else {
        lodepng_memcpy(key_00,in_RDX,(ulong)uVar3);
        key_00[uVar3] = '\0';
        if (*(char *)((long)in_RDX + (ulong)(uVar3 + 1)) == '\0') {
          uVar3 = uVar3 + 2;
          if (in_RCX < uVar3) {
            local_24 = 0x4b;
          }
          else {
            iVar1 = (int)in_RCX - uVar3;
            in = *(uchar **)((long)in_RSI + 0x40);
            local_24 = zlib_decompress(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                                       in_stack_ffffffffffffffc0,in,in_stack_ffffffffffffffb0,
                                       (LodePNGDecompressSettings *)CONCAT44(iVar1,uVar3));
            if ((local_24 != 0) && (in < size_00)) {
              local_24 = 0x70;
            }
            if (local_24 == 0) {
              local_24 = lodepng_add_text_sized
                                   ((LodePNGInfo *)CONCAT44(iVar1,uVar3),key_00,str_00,
                                    (size_t)size_00);
            }
          }
        }
        else {
          local_24 = 0x48;
        }
      }
    }
  }
  else {
    local_24 = 0x4b;
  }
  lodepng_free((void *)0x82077d);
  lodepng_free((void *)0x820787);
  return local_24;
}

Assistant:

static unsigned readChunk_zTXt(LodePNGInfo* info, const LodePNGDecoderSettings* decoder,
                               const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;

  /*copy the object to change parameters in it*/
  LodePNGDecompressSettings zlibsettings = decoder->zlibsettings;

  unsigned length, string2_begin;
  char *key = 0;
  unsigned char* str = 0;
  size_t size = 0;

  while(!error) /*not really a while loop, only used to break on error*/ {
    for(length = 0; length < chunkLength && data[length] != 0; ++length) ;
    if(length + 2 >= chunkLength) CERROR_BREAK(error, 75); /*no null termination, corrupt?*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(key, data, length);
    key[length] = 0;

    if(data[length + 1] != 0) CERROR_BREAK(error, 72); /*the 0 byte indicating compression must be 0*/

    string2_begin = length + 2;
    if(string2_begin > chunkLength) CERROR_BREAK(error, 75); /*no null termination, corrupt?*/

    length = (unsigned)chunkLength - string2_begin;
    zlibsettings.max_output_size = decoder->max_text_size;
    /*will fail if zlib error, e.g. if length is too small*/
    error = zlib_decompress(&str, &size, 0, &data[string2_begin],
                            length, &zlibsettings);
    /*error: compressed text larger than  decoder->max_text_size*/
    if(error && size > zlibsettings.max_output_size) error = 112;
    if(error) break;
    error = lodepng_add_text_sized(info, key, (char*)str, size);
    break;
  }

  lodepng_free(key);
  lodepng_free(str);

  return error;
}